

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool CoreML::isIOS12NeuralNetworkLayer(NeuralNetworkLayer *layer)

{
  uint32 uVar1;
  bool bVar2;
  LayerUnion LVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = layer->_oneof_case_[0];
  if ((int)uVar1 < 0xdc) {
    if ((int)uVar1 < 0x8c) {
      if (uVar1 == 100) {
        return (layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1;
      }
      if ((uVar1 != 0x78) && (uVar1 != 0x82)) {
        return false;
      }
LAB_0026ea72:
      LVar3.upsample_ = Specification::UpsampleLayerParams::default_instance();
    }
    else {
      uVar5 = (ulong)(uVar1 - 0x8c);
      if (uVar1 - 0x8c < 0x3d) {
        if ((0x4000042000400U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0026ea9d;
        if ((0x1000010800100000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0026ea72;
        if (uVar5 == 0) {
          return (bool)(*(byte *)((long)&(((layer->layer_).convolution_)->stride_).rep_ + 1) ^ 1);
        }
      }
      if (uVar1 - 0xd3 < 2) goto LAB_0026eadf;
      if (uVar1 != 0xd2) {
        return false;
      }
      LVar3 = layer->layer_;
    }
    if (((LVar3.convolution_)->dilationfactor_).current_size_ == 0) {
      if (layer->_oneof_case_[0] == 0xd2) {
        LVar3 = layer->layer_;
      }
      else {
        LVar3.upsample_ = Specification::UpsampleLayerParams::default_instance();
      }
      if (((LVar3.convolution_)->stride_).current_size_ < 1) goto LAB_0026ea9d;
    }
LAB_0026eabd:
    bVar2 = false;
  }
  else {
    if ((int)uVar1 < 0x122) {
      uVar4 = uVar1 - 0xdc;
      if (0x3c < uVar4) {
        return false;
      }
      if ((0x1004030042100000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        if ((0xc01UL >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          return false;
        }
        goto LAB_0026ea72;
      }
LAB_0026ea9d:
      if (layer->_oneof_case_[0] == 0x159) {
        LVar3 = layer->layer_;
      }
      else {
        LVar3.reorganizedata_ = Specification::ReorganizeDataLayerParams::default_instance();
      }
      if (*(int *)&((LVar3.convolution_)->kernelsize_).rep_ == 2) goto LAB_0026eabd;
    }
    else {
      uVar5 = (ulong)(uVar1 - 0x122);
      if (uVar1 - 0x122 < 0x3d) {
        if ((0x84000000100c01U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0026ea9d;
        if ((0x10040000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0026ea72;
        if (uVar5 != 0x3c) goto LAB_0026e9bf;
      }
      else {
LAB_0026e9bf:
        if ((uVar1 - 400 < 0x1f) && ((0x40100401U >> (uVar1 - 400 & 0x1f) & 1) != 0))
        goto LAB_0026ea9d;
        if (uVar1 != 500) {
          return false;
        }
      }
    }
LAB_0026eadf:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CoreML::isIOS12NeuralNetworkLayer(const Specification::NeuralNetworkLayer& layer) {

    // Return True if the NN layer is from the set exposed in iOS 12
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kConvolution:
            return (layer.input().size() == 1);
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct:
            return !layer.innerproduct().int8dynamicquantize();
        case Specification::NeuralNetworkLayer::LayerCase::kBatchnorm:
        case Specification::NeuralNetworkLayer::LayerCase::kActivation:
        case Specification::NeuralNetworkLayer::LayerCase::kPooling:
        case Specification::NeuralNetworkLayer::LayerCase::kPadding:
        case Specification::NeuralNetworkLayer::LayerCase::kConcat:
        case Specification::NeuralNetworkLayer::LayerCase::kLrn:
        case Specification::NeuralNetworkLayer::LayerCase::kSoftmax:
        case Specification::NeuralNetworkLayer::LayerCase::kSplit:
        case Specification::NeuralNetworkLayer::LayerCase::kAdd:
        case Specification::NeuralNetworkLayer::LayerCase::kMultiply:
        case Specification::NeuralNetworkLayer::LayerCase::kUnary:
        case Specification::NeuralNetworkLayer::LayerCase::kUpsample:
            if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                return false;
            }
            if (layer.upsample().fractionalscalingfactor_size() > 0) {
                return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kBias:
        case Specification::NeuralNetworkLayer::LayerCase::kL2Normalize:
        case Specification::NeuralNetworkLayer::LayerCase::kReshape:
        case Specification::NeuralNetworkLayer::LayerCase::kFlatten:
        case Specification::NeuralNetworkLayer::LayerCase::kPermute:
        case Specification::NeuralNetworkLayer::LayerCase::kReduce:
        case Specification::NeuralNetworkLayer::LayerCase::kLoadConstant:
        case Specification::NeuralNetworkLayer::LayerCase::kScale:
        case Specification::NeuralNetworkLayer::LayerCase::kSimpleRecurrent:
        case Specification::NeuralNetworkLayer::LayerCase::kGru:
        case Specification::NeuralNetworkLayer::LayerCase::kUniDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kBiDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kCrop:
        case Specification::NeuralNetworkLayer::LayerCase::kAverage:
        case Specification::NeuralNetworkLayer::LayerCase::kMax:
        case Specification::NeuralNetworkLayer::LayerCase::kMin:
        case Specification::NeuralNetworkLayer::LayerCase::kDot:
        case Specification::NeuralNetworkLayer::LayerCase::kMvn:
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding:
        case Specification::NeuralNetworkLayer::LayerCase::kSequenceRepeat:
        case Specification::NeuralNetworkLayer::LayerCase::kReorganizeData:
            if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kSlice:
        case Specification::NeuralNetworkLayer::LayerCase::kCustom:
        case Specification::NeuralNetworkLayer::kResizeBilinear:
        case Specification::NeuralNetworkLayer::kCropResize:
            return true;
        default:
            return false;
    }
}